

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_16fac41::HandleSizeCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  cmMakefile *this;
  char cVar2;
  bool bVar3;
  unsigned_long __val;
  unsigned_long uVar4;
  char cVar5;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  string_view value;
  string local_80;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_60;
  size_type local_48;
  char *local_40;
  undefined8 local_38;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 == 0x60) {
    cVar5 = '\x01';
    bVar3 = cmsys::SystemTools::FileExists(pbVar1 + 1,true);
    if (bVar3) {
      this = status->Makefile;
      __val = cmsys::SystemTools::FileLength(pbVar1 + 1);
      if (9 < __val) {
        uVar4 = __val;
        cVar2 = '\x04';
        do {
          cVar5 = cVar2;
          if (uVar4 < 100) {
            cVar5 = cVar5 + -2;
            goto LAB_0043f983;
          }
          if (uVar4 < 1000) {
            cVar5 = cVar5 + -1;
            goto LAB_0043f983;
          }
          if (uVar4 < 10000) goto LAB_0043f983;
          bVar3 = 99999 < uVar4;
          uVar4 = uVar4 / 10000;
          cVar2 = cVar5 + '\x04';
        } while (bVar3);
        cVar5 = cVar5 + '\x01';
      }
LAB_0043f983:
      local_60.first._M_len = (size_t)&local_60.second;
      std::__cxx11::string::_M_construct((ulong)&local_60,cVar5);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_60.first._M_len,(uint)local_60.first._M_str,__val);
      value._M_str = (char *)local_60.first._M_len;
      value._M_len = (size_t)local_60.first._M_str;
      cmMakefile::AddDefinition(this,pbVar1 + 2,value);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
          local_60.first._M_len != &local_60.second) {
        operator_delete((void *)local_60.first._M_len,
                        (ulong)((long)&((local_60.second)->_M_dataplus)._M_p + 1));
      }
      return true;
    }
    local_60.first._M_len = 0x2f;
    local_60.first._M_str = "SIZE requested of path that is not readable:\n  ";
    local_60.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_40 = pbVar1[1]._M_dataplus._M_p;
    local_48 = pbVar1[1]._M_string_length;
    local_38 = 0;
    views_00._M_len = 2;
    views_00._M_array = &local_60;
    cmCatViews(&local_80,views_00);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    local_60.first._M_str = (pbVar1->_M_dataplus)._M_p;
    local_60.first._M_len = pbVar1->_M_string_length;
    local_60.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_48 = 0x29;
    local_40 = " requires a file name and output variable";
    local_38 = 0;
    views._M_len = 2;
    views._M_array = &local_60;
    cmCatViews(&local_80,views);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool HandleSizeCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError(
      cmStrCat(args[0], " requires a file name and output variable"));
    return false;
  }

  unsigned int argsIndex = 1;

  const std::string& filename = args[argsIndex++];

  const std::string& outputVariable = args[argsIndex++];

  if (!cmSystemTools::FileExists(filename, true)) {
    status.SetError(
      cmStrCat("SIZE requested of path that is not readable:\n  ", filename));
    return false;
  }

  status.GetMakefile().AddDefinition(
    outputVariable, std::to_string(cmSystemTools::FileLength(filename)));

  return true;
}